

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestConsole.cpp
# Opt level: O3

void testConsole(void)

{
  char buffer [20000];
  undefined1 auStack_4e28 [19997];
  undefined2 local_b;
  
  Console::printf("%s\n","Hello world");
  Memory::fill(auStack_4e28,'a',0x4e1e);
  local_b = 0x62;
  Console::printf("%hs%hs\n",auStack_4e28,auStack_4e28);
  return;
}

Assistant:

void testConsole()
{
  // test printf
  {
    Console::printf("%s\n", "Hello world");
    char buffer[5000 * 4];
    usize bufferSize = sizeof(buffer) - 1;
    Memory::fill(buffer, 'a', bufferSize - 1);
    buffer[bufferSize - 2] = 'b';
    buffer[bufferSize - 1] = '\0';
    Console::printf("%hs%hs\n", buffer, buffer);
  }
}